

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

string * __thiscall
cmake::LogLevelToString_abi_cxx11_(string *__return_storage_ptr__,cmake *this,LogLevel level)

{
  uint uVar1;
  pointer_____offset_0x10___ *ppuVar2;
  pointer_____offset_0x10___ puVar3;
  char *pcVar4;
  string local_38;
  
  uVar1 = (int)this - 1;
  if (uVar1 < 6) {
    ppuVar2 = (pointer_____offset_0x10___ *)
              (&DAT_006883dc + *(int *)(&DAT_006883dc + (ulong)uVar1 * 4));
  }
  else {
    ppuVar2 = &SetCacheArgs(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
               ::$_0::typeinfo;
    if ((int)this == 7) {
      ppuVar2 = (pointer_____offset_0x10___ *)
                ((anonymous_namespace)::getStringToLogLevelPairs()::levels + 0x90);
    }
  }
  if (ppuVar2 ==
      &SetCacheArgs(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::
       $_0::typeinfo) {
    pcVar4 = "undefined";
    puVar3 = (pointer_____offset_0x10___)0x9;
  }
  else {
    puVar3 = *ppuVar2;
    pcVar4 = ppuVar2[1];
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar4,puVar3 + (long)pcVar4);
  cmsys::SystemTools::UpperCase(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::LogLevelToString(Message::LogLevel level)
{
  const LevelsPairArray& levels = getStringToLogLevelPairs();

  // NOLINTNEXTLINE(readability-qualified-auto)
  const auto it =
    std::find_if(levels.cbegin(), levels.cend(),
                 [&level](const LevelsPair& p) { return p.second == level; });
  const cm::string_view levelStrLowerCase =
    (it != levels.cend()) ? it->first : "undefined";
  std::string levelStrUpperCase =
    cmSystemTools::UpperCase(std::string{ levelStrLowerCase });
  return levelStrUpperCase;
}